

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::findCommonInLeaf<1>(InnerLeaf<1> *leaf,NodePtr n2,int hashPos)

{
  HighsHashTableEntry<int,_int> *pHVar1;
  ulong uVar2;
  long lVar3;
  ValueType *pVVar4;
  HighsHashTableEntry<int,_int> *pHVar5;
  byte bVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  switch((uint)n2.ptrAndType & 7) {
  case 2:
    pHVar5 = HighsHashTree<int,int>::findCommonInLeaf<1,1>
                       (leaf,(InnerLeaf<1> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar5;
  case 3:
    pHVar5 = HighsHashTree<int,int>::findCommonInLeaf<1,2>
                       (leaf,(InnerLeaf<2> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar5;
  case 4:
    pHVar5 = HighsHashTree<int,int>::findCommonInLeaf<1,3>
                       (leaf,(InnerLeaf<3> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar5;
  case 5:
    pHVar5 = HighsHashTree<int,int>::findCommonInLeaf<1,4>
                       (leaf,(InnerLeaf<4> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar5;
  case 6:
    puVar8 = (ulong *)(n2.ptrAndType & 0xfffffffffffffff8);
    uVar11 = (leaf->occupation).occupation & *puVar8;
    iVar10 = -1;
LAB_0028a6a7:
    if (uVar11 != 0) {
      lVar3 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      bVar6 = (byte)lVar3;
      lVar7 = (long)((int)POPCOUNT((leaf->occupation).occupation >> (bVar6 & 0x3f)) + iVar10);
      pHVar5 = (leaf->entries)._M_elems + lVar7;
      lVar9 = lVar7;
      while (lVar9 = lVar9 + 1, (uint)lVar3 != ((uint)(leaf->hashes)._M_elems[lVar7] >> 10 & 0x3f))
      {
        lVar7 = lVar7 + 1;
        iVar10 = iVar10 + 1;
        pHVar5 = pHVar5 + 1;
      }
      uVar11 = uVar11 ^ 1L << (bVar6 & 0x3f);
      uVar2 = *puVar8;
      do {
        pVVar4 = find_recurse((NodePtr)puVar8[POPCOUNT(uVar2 >> (bVar6 & 0x3f))],
                              (ulong)(uint)pHVar5->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                              >> 0x20 ^ (ulong)(uint)pHVar5->key_ * -0x75e7c76a1153eaca +
                                        0x1da24fc66dd63e32,hashPos + 1,&pHVar5->key_);
        if (pVVar4 != (ValueType *)0x0) {
          return pHVar5;
        }
        if (leaf->size <= lVar9) break;
        pHVar1 = pHVar5 + -6;
        pHVar5 = pHVar5 + 1;
        lVar9 = lVar9 + 1;
      } while ((uint)lVar3 == ((uint)pHVar1->key_ >> 10 & 0x3f));
      goto LAB_0028a6a7;
    }
  }
  return (HighsHashTableEntry<int,_int> *)0x0;
}

Assistant:

static HighsHashTableEntry<K, V>* findCommonInLeaf(InnerLeaf<SizeClass>* leaf,
                                                     NodePtr n2, int hashPos) {
    switch (n2.getType()) {
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass1(), hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass2(), hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass3(), hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass4(), hashPos);
      case kBranchNode: {
        BranchNode* branch = n2.getBranchNode();
        uint64_t matchMask = branch->occupation & leaf->occupation;

        int offset = -1;
        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          matchMask ^= (uint64_t{1} << pos);

          int i = leaf->occupation.num_set_until(static_cast<uint8_t>(pos)) +
                  offset;
          while (get_first_chunk16(leaf->hashes[i]) != pos) {
            ++i;
            ++offset;
          }

          int j =
              branch->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          do {
            if (find_recurse(branch->child[j],
                             compute_hash(leaf->entries[i].key()), hashPos + 1,
                             leaf->entries[i].key()))
              return &leaf->entries[i];
            ++i;
          } while (i < leaf->size && get_first_chunk16(leaf->hashes[i]) == pos);
        }
        break;
      }
      default:
        break;
    }

    return nullptr;
  }